

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5StorageInsert(int *pRc,Fts5FullTable *pTab,sqlite3_value **apVal,i64 *piRowid)

{
  int local_2c;
  int rc;
  i64 *piRowid_local;
  sqlite3_value **apVal_local;
  Fts5FullTable *pTab_local;
  int *pRc_local;
  
  local_2c = *pRc;
  if (local_2c == 0) {
    local_2c = sqlite3Fts5StorageContentInsert(pTab->pStorage,apVal,piRowid);
  }
  if (local_2c == 0) {
    local_2c = sqlite3Fts5StorageIndexInsert(pTab->pStorage,apVal,*piRowid);
  }
  *pRc = local_2c;
  return;
}

Assistant:

static void fts5StorageInsert(
  int *pRc, 
  Fts5FullTable *pTab, 
  sqlite3_value **apVal, 
  i64 *piRowid
){
  int rc = *pRc;
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5StorageContentInsert(pTab->pStorage, apVal, piRowid);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5StorageIndexInsert(pTab->pStorage, apVal, *piRowid);
  }
  *pRc = rc;
}